

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_DimLinear::GetBBox
          (ON_OBSOLETE_V5_DimLinear *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool bVar1;
  int iVar2;
  ON_2dPoint *pOVar3;
  ON_3dPoint local_f8;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_3dPoint local_b0;
  double dStack_88;
  ON_2dPoint uv;
  undefined1 local_70 [8];
  ON_3dPointArray P;
  ON_BoundingBox bbox;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_OBSOLETE_V5_DimLinear *this_local;
  
  bbox.m_max.z._7_1_ = bGrowBox;
  ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&P.super_ON_SimpleArray<ON_3dPoint>.m_count);
  if ((bbox.m_max.z._7_1_ & 1) != 0) {
    P.super_ON_SimpleArray<ON_3dPoint>._16_8_ = *boxmin;
    bbox.m_min.x = boxmin[1];
    bbox.m_min.y = boxmin[2];
    bbox.m_min.z = *boxmax;
    bbox.m_max.x = boxmax[1];
    bbox.m_max.y = boxmax[2];
    bVar1 = ON_BoundingBox::IsValid((ON_BoundingBox *)&P.super_ON_SimpleArray<ON_3dPoint>.m_count);
    if (!bVar1) {
      ON_BoundingBox::Destroy((ON_BoundingBox *)&P.super_ON_SimpleArray<ON_3dPoint>.m_count);
      bbox.m_max.z._7_1_ = 0;
    }
  }
  iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  if (iVar2 == 5) {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)local_70,5);
    if (((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext & 1U) != 0) {
      pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,0);
      dStack_88 = pOVar3->x;
      uv.x = pOVar3->y;
      ON_Plane::PointAt(&local_b0,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dStack_88,uv.x);
      ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_70,&local_b0);
    }
    ON_SimpleArray<ON_3dPoint>::Append
              ((ON_SimpleArray<ON_3dPoint> *)local_70,
               &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin);
    dStack_88 = 0.0;
    pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    uv.x = pOVar3->y;
    ON_Plane::PointAt(&local_c8,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dStack_88,uv.x);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_70,&local_c8);
    pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,2);
    dStack_88 = pOVar3->x;
    uv.x = pOVar3->y;
    ON_Plane::PointAt(&local_e0,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dStack_88,uv.x);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_70,&local_e0);
    pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    uv.x = pOVar3->y;
    ON_Plane::PointAt(&local_f8,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dStack_88,uv.x);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_70,&local_f8);
    bbox.m_max.z._7_1_ =
         ON_3dPointArray::GetBBox
                   ((ON_3dPointArray *)local_70,
                    (double *)&P.super_ON_SimpleArray<ON_3dPoint>.m_count,&bbox.m_min.z,
                    (bool)(bbox.m_max.z._7_1_ & 1));
    ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_70);
  }
  if ((bbox.m_max.z._7_1_ & 1) != 0) {
    *boxmin = (double)P.super_ON_SimpleArray<ON_3dPoint>._16_8_;
    boxmin[1] = bbox.m_min.x;
    boxmin[2] = bbox.m_min.y;
    *boxmax = bbox.m_min.z;
    boxmax[1] = bbox.m_max.x;
    boxmax[2] = bbox.m_max.y;
  }
  return (bool)(bbox.m_max.z._7_1_ & 1);
}

Assistant:

bool ON_OBSOLETE_V5_DimLinear::GetBBox(
        double* boxmin,
        double* boxmax,
        bool bGrowBox
        ) const
{
  ON_BoundingBox bbox;
  if ( bGrowBox )
  {
    bbox.m_min.x = boxmin[0]; 
    bbox.m_min.y = boxmin[1]; 
    bbox.m_min.z = boxmin[2];
    bbox.m_max.x = boxmax[0]; 
    bbox.m_max.y = boxmax[1]; 
    bbox.m_max.z = boxmax[2];
    if ( !bbox.IsValid() )
    {
      bbox.Destroy();
      bGrowBox = false;
    }
  }

  if ( 5 == m_points.Count() )
  {
    ON_3dPointArray P(5);
    ON_2dPoint uv;
    if ( m_userpositionedtext )
    {
      uv = m_points[0]; // point someplace in text
      P.Append( m_plane.PointAt(uv.x,uv.y) );
    }

    P.Append( m_plane.origin );

    uv.x = 0.0;
    uv.y = m_points[1].y;
    P.Append( m_plane.PointAt(uv.x,uv.y) );

    uv = m_points[2];
    P.Append( m_plane.PointAt(uv.x,uv.y) );

    uv.y = m_points[1].y;
    P.Append( m_plane.PointAt(uv.x,uv.y) );
    bGrowBox = P.GetBBox(&bbox.m_min.x, &bbox.m_max.x, bGrowBox);
  }

  if ( bGrowBox )
  {
    boxmin[0] = bbox.m_min.x; 
    boxmin[1] = bbox.m_min.y; 
    boxmin[2] = bbox.m_min.z; 
    boxmax[0] = bbox.m_max.x; 
    boxmax[1] = bbox.m_max.y; 
    boxmax[2] = bbox.m_max.z; 
  }

  return bGrowBox;
}